

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_symboltable.c
# Opt level: O1

void check_upvalue_inscope
               (gravity_hash_t *hashtable,gravity_value_t key,gravity_value_t value,void *data)

{
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar1;
  
  aVar1 = value.field_1;
  if ((((aVar1.n != 0) && (*(int *)&(aVar1.p)->isa == 0xc)) && (*(char *)(aVar1.n + 0x6e) == '\x01')
      ) && ((*data == 0xffffffff || ((uint)*(ushort *)(aVar1.n + 0x6c) < *data)))) {
    *(uint *)data = (uint)*(ushort *)(aVar1.n + 0x6c);
  }
  return;
}

Assistant:

static void check_upvalue_inscope (gravity_hash_t *hashtable, gravity_value_t key, gravity_value_t value, void *data) {
    #pragma unused(hashtable, key)

    uint32_t index = *(uint32_t *)data;
    gnode_t *node = VALUE_AS_NODE(value);
    if (NODE_ISA(node, NODE_VARIABLE)) {
        gnode_var_t *var = (gnode_var_t *)node;
        if (var->upvalue) {
            if ((index == UINT32_MAX) || (var->index < index)) *(uint32_t *)data = var->index;
        }
    }
}